

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O1

void __thiscall
OpenMesh::BaseKernel::
add_property<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
          (BaseKernel *this,
          EPropHandleT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
          *_ph,string *_name)

{
  pointer ppBVar1;
  BaseProperty *pBVar2;
  BasePropHandleT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  BVar3;
  int iVar4;
  undefined4 extraout_var;
  pointer ppBVar5;
  EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>
  local_21;
  
  BVar3 = PropertyContainer::
          add<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
                    (&this->eprops_,&local_21,_name);
  (_ph->
  super_BasePropHandleT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  ).super_BaseHandle.idx_ = (int)BVar3.super_BaseHandle.idx_;
  iVar4 = (*this->_vptr_BaseKernel[4])(this);
  ppBVar1 = (this->eprops_).properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar5 = (this->eprops_).properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar5 != ppBVar1;
      ppBVar5 = ppBVar5 + 1) {
    pBVar2 = *ppBVar5;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var,iVar4));
    }
  }
  return;
}

Assistant:

void add_property( EPropHandleT<T>& _ph, const std::string& _name="<eprop>")
  {
    _ph = EPropHandleT<T>( eprops_.add(T(), _name) );
    eprops_.resize(n_edges());
  }